

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float32 float32_log2_m68k(float32 a,float_status *status)

{
  bool bVar1;
  uint uVar2;
  float32 fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  if ((status->flush_inputs_to_zero == '\0') || ((a & 0x7fffff) == 0 || (a & 0x7f800000) != 0)) {
    uVar7 = (ulong)a;
  }
  else {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    uVar7 = (ulong)(a & 0x80000000);
  }
  uVar2 = (uint)uVar7;
  uVar5 = uVar2 & 0x7fffff;
  uVar8 = (uint)(uVar7 >> 0x17) & 0xff;
  if ((uVar7 >> 0x17 & 0xff) == 0) {
    if ((uVar7 & 0x7fffff) == 0) {
      return 0xff800000;
    }
    uVar8 = 0x1f;
    if ((uVar7 & 0x7fffff) != 0) {
      for (; uVar5 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar5 = uVar5 << ((char)(uVar8 ^ 0x1f) - 8U & 0x1f);
    uVar8 = 9 - (uVar8 ^ 0x1f);
  }
  if ((int)uVar2 < 0) {
    status->float_exception_flags = status->float_exception_flags | 1;
    uVar2 = 0x7fffffff;
  }
  else {
    if (uVar8 != 0xff) {
      uVar5 = uVar5 | 0x800000;
      uVar4 = uVar8 * 0x800000 + 0xc0800000;
      uVar2 = 0x400000;
      do {
        uVar7 = (ulong)uVar5 * (ulong)uVar5;
        uVar6 = (uint)(uVar7 >> 0x17);
        uVar5 = uVar6 >> ((byte)(uint)(uVar7 >> 0x2f) & 1);
        uVar4 = uVar4 | (int)(uVar6 << 7) >> 0x1f & uVar2;
        bVar1 = 1 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar1);
      uVar2 = -uVar4;
      if (0x7e < (int)uVar8) {
        uVar2 = uVar4;
      }
      if (uVar2 == 0) {
        uVar5 = 0x20;
      }
      else {
        uVar5 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = uVar5 ^ 0x1f;
      }
      fVar3 = roundAndPackFloat32((int)uVar8 < 0x7f,0x86 - uVar5,uVar2 << ((char)uVar5 - 1U & 0x1f),
                                  status);
      return fVar3;
    }
    if (uVar5 != 0) {
      fVar3 = propagateFloat32NaN(uVar2,0,status);
      return fVar3;
    }
  }
  return uVar2;
}

Assistant:

float32 float32_log2(float32 a, float_status *status)
{
    flag aSign, zSign;
    int aExp;
    uint32_t aSig, zSig, i;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );

    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat32( 1, 0xFF, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    if ( aSign ) {
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    if ( aExp == 0xFF ) {
        if (aSig) {
            return propagateFloat32NaN(a, float32_zero, status);
        }
        return a;
    }

    aExp -= 0x7F;
    aSig |= 0x00800000;
    zSign = aExp < 0;
    zSig = aExp << 23;

    for (i = 1 << 22; i > 0; i >>= 1) {
        aSig = ( (uint64_t)aSig * aSig ) >> 23;
        if ( aSig & 0x01000000 ) {
            aSig >>= 1;
            zSig |= i;
        }
    }

    if ( zSign )
#ifdef _MSC_VER
        zSig = 0 - zSig;
#else
        zSig = -zSig;
#endif

    return normalizeRoundAndPackFloat32(zSign, 0x85, zSig, status);
}